

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

bool __thiscall cppcms::widgets::base_text::validate(base_text *this)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  
  uVar4 = *(uint *)(&this->field_0x1f0 + (long)this->_vptr_base_text[-3]);
  if ((uVar4 & 1) == 0) {
    return false;
  }
  iVar1 = this->low_;
  uVar2 = this->high_;
  bVar3 = (uVar4 & 2) == 0;
  if (uVar2 != 0xffffffff || (!bVar3 || iVar1 != 0)) {
    if (((ulong)(long)iVar1 <= this->code_points_) &&
       (this->code_points_ <= (ulong)uVar2 || (int)uVar2 < 0)) {
      return true;
    }
    uVar4 = uVar4 & 0xfffffffe;
  }
  *(uint *)(&this->field_0x1f0 + (long)this->_vptr_base_text[-3]) = uVar4;
  return uVar2 == 0xffffffff && (bVar3 && iVar1 == 0);
}

Assistant:

bool base_text::validate()
{
	if(!valid())
		return false;
	if(!set() && low_==0 && high_==-1) {
		valid(true);
		return true;
	}
	if(code_points_ < size_t(low_) || (high_ >=0 && code_points_ > size_t(high_))) {
		valid(false);
		return false;
	}
	return true;
}